

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_convolve_y_sr_c(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
                        InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  ushort uVar1;
  int16_t *piVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar1 = filter_params_y->taps;
  piVar2 = filter_params_y->filter_ptr;
  lVar7 = (long)src_stride;
  uVar8 = (ulong)(uint)w;
  if (w < 1) {
    uVar8 = 0;
  }
  uVar9 = (ulong)(uint)h;
  if (h < 1) {
    uVar9 = 0;
  }
  pbVar4 = src + (1 - (ulong)(uVar1 >> 1)) * lVar7;
  for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
    pbVar5 = pbVar4;
    for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
      iVar6 = 0;
      pbVar10 = pbVar5;
      for (uVar3 = 0; filter_params_y->taps != uVar3; uVar3 = uVar3 + 1) {
        iVar6 = iVar6 + (uint)*pbVar10 *
                        (int)*(short *)((long)piVar2 +
                                       uVar3 * 2 + (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
        pbVar10 = pbVar10 + lVar7;
      }
      iVar6 = iVar6 + 0x40 >> 7;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      dst[uVar11 + uVar12 * (long)dst_stride] = (uint8_t)iVar6;
      pbVar5 = pbVar5 + 1;
    }
    pbVar4 = pbVar4 + lVar7;
  }
  return;
}

Assistant:

void av1_convolve_y_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                         int dst_stride, int w, int h,
                         const InterpFilterParams *filter_params_y,
                         const int subpel_y_qn) {
  const int fo_vert = filter_params_y->taps / 2 - 1;

  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      dst[y * dst_stride + x] =
          clip_pixel(ROUND_POWER_OF_TWO(res, FILTER_BITS));
    }
  }
}